

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint16 crnlib::etc1_block::pack_color5(uint r,uint g,uint b,bool scaled,uint bias)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint bias_local;
  uint uStack_10;
  bool scaled_local;
  uint b_local;
  uint g_local;
  uint r_local;
  
  bias_local = b;
  uStack_10 = g;
  b_local = r;
  if (scaled) {
    b_local = (r * 0x1f + bias) / 0xff;
    uStack_10 = (g * 0x1f + bias) / 0xff;
    bias_local = (b * 0x1f + bias) / 0xff;
  }
  uVar1 = math::minimum<unsigned_int>(b_local,0x1f);
  uVar2 = math::minimum<unsigned_int>(uStack_10,0x1f);
  uVar3 = math::minimum<unsigned_int>(bias_local,0x1f);
  return (ushort)uVar3 | (ushort)(uVar2 << 5) | (ushort)(uVar1 << 10);
}

Assistant:

uint16 etc1_block::pack_color5(uint r, uint g, uint b, bool scaled, uint bias)
    {
        if (scaled)
        {
            r = (r * 31U + bias) / 255U;
            g = (g * 31U + bias) / 255U;
            b = (b * 31U + bias) / 255U;
        }

        r = math::minimum(r, 31U);
        g = math::minimum(g, 31U);
        b = math::minimum(b, 31U);

        return static_cast<uint16>(b | (g << 5U) | (r << 10U));
    }